

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::ProcessBailOutInfo(BackwardPass *this,Instr *instr,BailOutInfo *bailOutInfo)

{
  code *pcVar1;
  anon_class_16_2_c5e3ac14 callback;
  CopyPropSyms *this_00;
  ConstantStackSymValue *this_01;
  bool bVar2;
  IRType IVar3;
  uint32 uVar4;
  uint32 uVar5;
  BOOL BVar6;
  RegSlot RVar7;
  SymID SVar8;
  BasicBlock *pBVar9;
  undefined4 *puVar10;
  JitArenaAllocator *pJVar11;
  BVSparse<Memory::JitArenaAllocator> *pBVar12;
  Type_conflict pSVar13;
  Type *this_02;
  Instr *pIVar14;
  StackSym *pSVar15;
  StackSym *float64StackSym;
  StackSym *stackSym_1;
  SparseBVUnit _unit_1;
  BVIndex _startIndex_1;
  BVIndex _offset_1;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode_1;
  BVIndex symId_1;
  StackSym *int32StackSym;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex symId;
  CopyPropSyms *value_1;
  Iterator __iter_1;
  ConstantStackSymValue *value;
  Iterator __iter;
  TrackAllocData local_100;
  BVSparse<Memory::JitArenaAllocator> *local_d8;
  BVSparse<Memory::JitArenaAllocator> *tempBv;
  code *local_c8;
  BVSparse<Memory::JitArenaAllocator> *local_c0;
  TrackAllocData local_b8;
  anon_class_8_1_cdd3212f local_90;
  BVSparse<Memory::JitArenaAllocator> *bailoutReferencedArgSymsBv;
  BVSparse<Memory::JitArenaAllocator> *branchTargetUpwardExposed;
  LabelInstr *pLStack_78;
  uint32 targetOffset;
  LabelInstr *target;
  BranchInstr *branchInstr;
  BVSparse<Memory::JitArenaAllocator> *tmpBv;
  BVSparse<Memory::JitArenaAllocator> *trackingByteCodeUpwardExposedUsed;
  BVSparse<Memory::JitArenaAllocator> *pBStack_50;
  uint32 offset;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed;
  BasicBlock *block;
  BailOutInfo *bailOutInfo_local;
  Instr *instr_local;
  BackwardPass *this_local;
  bool local_19;
  CopyPropSyms **local_18;
  bool local_9;
  
  byteCodeUpwardExposedUsed = (BVSparse<Memory::JitArenaAllocator> *)this->currentBlock;
  pBStack_50 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  block = (BasicBlock *)bailOutInfo;
  bailOutInfo_local = (BailOutInfo *)instr;
  instr_local = (Instr *)this;
  bVar2 = DoCaptureByteCodeUpwardExposedUsed(this);
  if ((((bVar2) && (bVar2 = IsPrePass(this), !bVar2)) &&
      (bVar2 = Func::HasByteCodeOffset((Func *)block->noImplicitCallJsArrayHeadSegmentSymUses),
      bVar2)) &&
     (block->noImplicitCallJsArrayHeadSegmentSymUses[0x12].lastFoundIndex != (Type_conflict)0x0)) {
    trackingByteCodeUpwardExposedUsed._4_4_ = *(uint *)((long)&block->prev + 4);
    if (trackingByteCodeUpwardExposedUsed._4_4_ == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa77,"(offset != Js::Constants::NoByteCodeOffset)",
                         "offset != Js::Constants::NoByteCodeOffset");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    tmpBv = Func::GetByteCodeOffsetUses
                      ((Func *)block->noImplicitCallJsArrayHeadSegmentSymUses,
                       trackingByteCodeUpwardExposedUsed._4_4_);
    if (tmpBv != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      branchInstr = (BranchInstr *)0x0;
      bVar2 = IR::Instr::IsBranchInstr((Instr *)bailOutInfo_local);
      if (bVar2) {
        target = (LabelInstr *)IR::Instr::AsBranchInstr((Instr *)bailOutInfo_local);
        pLStack_78 = IR::BranchInstr::GetTarget((BranchInstr *)target);
        uVar4 = IR::Instr::GetByteCodeOffset(&pLStack_78->super_Instr);
        branchTargetUpwardExposed._4_4_ = uVar4;
        uVar5 = IR::Instr::GetByteCodeOffset((Instr *)bailOutInfo_local);
        pBVar12 = byteCodeUpwardExposedUsed;
        if ((uVar4 == uVar5) &&
           (pBVar9 = IR::LabelInstr::GetBasicBlock(pLStack_78), (BasicBlock *)pBVar12 != pBVar9)) {
          pBVar9 = IR::LabelInstr::GetBasicBlock(pLStack_78);
          if ((((*(ushort *)&pBVar9->field_0x18 >> 9 & 1) == 0) &&
              ((pBVar9 = IR::LabelInstr::GetBasicBlock(pLStack_78),
               (*(ushort *)&pBVar9->field_0x18 >> 6 & 1) == 0 &&
               (pBVar9 = IR::LabelInstr::GetBasicBlock(pLStack_78),
               (*(ushort *)&pBVar9->field_0x18 >> 8 & 1) == 0)))) &&
             ((pBVar9 = IR::LabelInstr::GetBasicBlock(pLStack_78),
              (*(ushort *)&pBVar9->field_0x18 >> 10 & 1) == 0 &&
              (pBVar9 = IR::LabelInstr::GetBasicBlock(pLStack_78),
              (*(ushort *)&pBVar9->field_0x18 >> 0xb & 1) == 0)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xa8e,
                               "(target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource)"
                               ,
                               "target->GetBasicBlock()->isAirLockBlock || target->GetBasicBlock()->isAirLockCompensationBlock || target->GetBasicBlock()->isBreakBlock || target->GetBasicBlock()->isBreakCompensationBlockAtSink || target->GetBasicBlock()->isBreakCompensationBlockAtSource"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          pIVar14 = IR::Instr::GetNextByteCodeInstr(&pLStack_78->super_Instr);
          branchTargetUpwardExposed._4_4_ = IR::Instr::GetByteCodeOffset(pIVar14);
        }
        bailoutReferencedArgSymsBv =
             Func::GetByteCodeOffsetUses
                       ((pLStack_78->super_Instr).m_func,branchTargetUpwardExposed._4_4_);
        if (bailoutReferencedArgSymsBv != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          branchInstr = (BranchInstr *)
                        BVSparse<Memory::JitArenaAllocator>::OrNew(tmpBv,bailoutReferencedArgSymsBv)
          ;
          tmpBv = (BVSparse<Memory::JitArenaAllocator> *)branchInstr;
        }
      }
      if (tmpBv == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0xa99,"(trackingByteCodeUpwardExposedUsed)",
                           "trackingByteCodeUpwardExposedUsed");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      VerifyByteCodeUpwardExposed
                (this,(BasicBlock *)byteCodeUpwardExposedUsed,
                 (Func *)block->noImplicitCallJsArrayHeadSegmentSymUses,tmpBv,
                 (Instr *)bailOutInfo_local,trackingByteCodeUpwardExposedUsed._4_4_);
      if (branchInstr != (BranchInstr *)0x0) {
        pJVar11 = BVSparse<Memory::JitArenaAllocator>::GetAllocator
                            ((BVSparse<Memory::JitArenaAllocator> *)branchInstr);
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                  (pJVar11,(BVSparse<Memory::JitArenaAllocator> *)branchInstr);
      }
    }
  }
  if ((BailOutInfo *)block->noImplicitCallUses != bailOutInfo_local) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaa3,"(bailOutInfo->bailOutInstr == instr)",
                       "bailOutInfo->bailOutInstr == instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((block->upwardExposedUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     ((BVar6 = Func::HasTry(this->func), BVar6 == 0 ||
      (bVar2 = Func::DoOptimizeTry(this->func), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xaa8,
                       "(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()))"
                       ,
                       "bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry())"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar2 = IsPrePass(this);
  if (bVar2) {
    pBStack_50 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                           ((BVSparse<Memory::JitArenaAllocator> *)
                            byteCodeUpwardExposedUsed[0xd].lastFoundIndex,this->tempAlloc);
  }
  else {
    pBStack_50 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                           ((BVSparse<Memory::JitArenaAllocator> *)
                            byteCodeUpwardExposedUsed[0xd].lastFoundIndex,this->func->m_alloc);
    block->upwardExposedUses = pBStack_50;
  }
  pJVar11 = this->tempAlloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_b8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
             ,0xabc);
  pJVar11 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar11,&local_b8);
  local_c8 = Memory::JitArenaAllocator::Alloc;
  local_c0 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar11,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar12,this->tempAlloc);
  local_90.bailoutReferencedArgSymsBv = pBVar12;
  bVar2 = IsPrePass(this);
  if (!bVar2) {
    tempBv = local_90.bailoutReferencedArgSymsBv;
    BailOutInfo::IterateArgOutSyms<BackwardPass::ProcessBailOutInfo(IR::Instr*,BailOutInfo*)::__0>
              ((BailOutInfo *)block,local_90);
  }
  ProcessBailOutArgObj(this,(BailOutInfo *)block,pBStack_50);
  if ((short)bailOutInfo_local->polymorphicCacheIndex != 0x23f) {
    ProcessBailOutConstants
              (this,(BailOutInfo *)block,pBStack_50,local_90.bailoutReferencedArgSymsBv);
    ProcessBailOutCopyProps
              (this,(BailOutInfo *)block,pBStack_50,local_90.bailoutReferencedArgSymsBv);
  }
  pJVar11 = this->tempAlloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_100,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
             ,0xad0);
  pJVar11 = (JitArenaAllocator *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar11,&local_100);
  __iter.current = (NodeBase *)Memory::JitArenaAllocator::Alloc;
  pBVar12 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,pJVar11,0x4e98c0);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar12,this->tempAlloc);
  local_d8 = pBVar12;
  if (block->tempObjectVerifyTracker == (TempObjectVerifyTracker *)0x0) {
    bVar2 = Func::DoGlobOpt(this->func);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xb29,"(!this->func->DoGlobOpt())","!this->func->DoGlobOpt()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  else {
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar12);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xad8,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Minus
              (local_d8,pBStack_50,
               (BVSparse<Memory::JitArenaAllocator> *)block->tempObjectVerifyTracker);
    BVSparse<Memory::JitArenaAllocator>::Minus
              (local_d8,(BVSparse<Memory::JitArenaAllocator> *)block->stackSymToFinalType);
    BVSparse<Memory::JitArenaAllocator>::Minus
              (local_d8,(BVSparse<Memory::JitArenaAllocator> *)block->stackSymToGuardedProperties);
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(local_d8);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xade,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    bVar2 = Func::IsJitInDebugMode(this->func);
    if (bVar2) {
      if (this->func->m_nonTempLocalVars == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0xae5,"(this->func->m_nonTempLocalVars)",
                           "this->func->m_nonTempLocalVars");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::And
                (local_d8,this->func->m_nonTempLocalVars,
                 (BVSparse<Memory::JitArenaAllocator> *)block->tempObjectVerifyTracker);
      _value = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::GetIterator((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                              *)block->liveFixedFields);
      while( true ) {
        this_local = (BackwardPass *)&value;
        if (__iter.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        this_01 = value;
        pSVar13 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                          *)this_01,pSVar13);
        if (!bVar2) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_19 = !bVar2;
        if (!local_19) break;
        __iter_1.current =
             (NodeBase *)
             SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)&value);
        pSVar15 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key
                            ((KeyValuePair<StackSym_*,_BailoutConstantValue> *)__iter_1.current);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar15);
        if (!bVar2) {
          pSVar15 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key
                              ((KeyValuePair<StackSym_*,_BailoutConstantValue> *)__iter_1.current);
          pIVar14 = StackSym::GetInstrDef(pSVar15);
          if (pIVar14->m_opcode != BytecodeArgOutCapture) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xaeb,
                               "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                               ,
                               "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
        }
        pSVar15 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key
                            ((KeyValuePair<StackSym_*,_BailoutConstantValue> *)__iter_1.current);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar15);
        pBVar12 = local_d8;
        if (bVar2) {
          pSVar15 = JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>::Key
                              ((KeyValuePair<StackSym_*,_BailoutConstantValue> *)__iter_1.current);
          RVar7 = StackSym::GetByteCodeRegSlot(pSVar15);
          BVSparse<Memory::JitArenaAllocator>::Clear(pBVar12,RVar7);
        }
      }
      _value_1 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 ::GetIterator((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                                *)&block->liveFixedFields->alloc);
      while( true ) {
        local_18 = &value_1;
        if (__iter_1.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        this_00 = value_1;
        pSVar13 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::IsHead((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                          *)this_00,pSVar13);
        if (!bVar2) {
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
        local_9 = !bVar2;
        if (!local_9) break;
        this_02 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)&value_1);
        pSVar15 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(this_02);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar15);
        if (!bVar2) {
          pSVar15 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(this_02);
          pIVar14 = StackSym::GetInstrDef(pSVar15);
          if (pIVar14->m_opcode != BytecodeArgOutCapture) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xaf4,
                               "(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture)"
                               ,
                               "value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
        }
        pSVar15 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(this_02);
        bVar2 = StackSym::HasByteCodeRegSlot(pSVar15);
        pBVar12 = local_d8;
        if (bVar2) {
          pSVar15 = JsUtil::KeyValuePair<StackSym_*,_StackSym_*>::Key(this_02);
          RVar7 = StackSym::GetByteCodeRegSlot(pSVar15);
          BVSparse<Memory::JitArenaAllocator>::Clear(pBVar12,RVar7);
        }
      }
      if (block->liveFixedFields[1].head != (Type_conflict)0x0) {
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (local_d8,(BVSparse<Memory::JitArenaAllocator> *)block->liveFixedFields[1].head);
      }
      BVSparse<Memory::JitArenaAllocator>::Or(pBStack_50,local_d8);
    }
    if ((short)bailOutInfo_local->polymorphicCacheIndex != 0x23f) {
      BVSparse<Memory::JitArenaAllocator>::And
                (local_d8,pBStack_50,
                 (BVSparse<Memory::JitArenaAllocator> *)block->stackSymToFinalType);
      BVSparse<Memory::JitArenaAllocator>::Minus(pBStack_50,local_d8);
      for (__startIndex = local_d8->head; __startIndex != (Type_conflict)0x0;
          __startIndex = __startIndex->next) {
        _unit.word._0_4_ = __startIndex->startIndex;
        stackSym = (StackSym *)(__startIndex->data).word;
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
        while (_unit.word._4_4_ != 0xffffffff) {
          SVar8 = (Type)_unit.word + _unit.word._4_4_;
          BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
          pSVar15 = SymTable::FindStackSym(this->func->m_symTable,SVar8);
          IVar3 = StackSym::GetType(pSVar15);
          if (IVar3 != TyVar) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb0b,"(stackSym->GetType() == TyVar)",
                               "stackSym->GetType() == TyVar");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          pSVar15 = StackSym::GetInt32EquivSym(pSVar15,(Func *)0x0);
          if (pSVar15 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb0d,"(int32StackSym)","int32StackSym");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::Set(pBStack_50,(pSVar15->super_Sym).m_id);
          _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym)
          ;
        }
        if (__startIndex == (Type_conflict)0x0) break;
      }
      BVSparse<Memory::JitArenaAllocator>::And
                (local_d8,pBStack_50,
                 (BVSparse<Memory::JitArenaAllocator> *)block->stackSymToGuardedProperties);
      BVSparse<Memory::JitArenaAllocator>::Minus(pBStack_50,local_d8);
      for (__startIndex_1 = local_d8->head; __startIndex_1 != (Type_conflict)0x0;
          __startIndex_1 = __startIndex_1->next) {
        _unit_1.word._0_4_ = __startIndex_1->startIndex;
        stackSym_1 = (StackSym *)(__startIndex_1->data).word;
        _unit_1.word._4_4_ =
             BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym_1);
        while (_unit_1.word._4_4_ != 0xffffffff) {
          SVar8 = (Type)_unit_1.word + _unit_1.word._4_4_;
          BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym_1,_unit_1.word._4_4_);
          pSVar15 = SymTable::FindStackSym(this->func->m_symTable,SVar8);
          IVar3 = StackSym::GetType(pSVar15);
          if (IVar3 != TyVar) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb18,"(stackSym->GetType() == TyVar)",
                               "stackSym->GetType() == TyVar");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          pSVar15 = StackSym::GetFloat64EquivSym(pSVar15,(Func *)0x0);
          if (pSVar15 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0xb1a,"(float64StackSym)","float64StackSym");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          BVSparse<Memory::JitArenaAllocator>::Set(pBStack_50,(pSVar15->super_Sym).m_id);
          *(uint *)&pSVar15->field_0x18 = *(uint *)&pSVar15->field_0x18 & 0xfffdffff | 0x20000;
          _unit_1.word._4_4_ =
               BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym_1);
        }
        if (__startIndex_1 == (Type_conflict)0x0) break;
      }
    }
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (this->tempAlloc,local_d8);
  if (((((short)bailOutInfo_local->polymorphicCacheIndex == 0x237) &&
       (bVar2 = Func::IsInlinee((Func *)bailOutInfo_local->usedCapturedValues), bVar2)) &&
      ((*(uint *)&bailOutInfo_local->usedCapturedValues[0xc].constantValues.
                  super_SListNodeBase<Memory::ArenaAllocator>.next >> 1 & 1) != 0)) &&
     (((ulong)bailOutInfo_local->usedCapturedValues[0xe].constantValues.
              super_SListNodeBase<Memory::ArenaAllocator>.next[9].next & 1) != 0)) {
    InlineeFrameInfo::IterateSyms<BackwardPass::ProcessBailOutInfo(IR::Instr*,BailOutInfo*)::__1>
              ((InlineeFrameInfo *)
               bailOutInfo_local->usedCapturedValues[0xe].constantValues.
               super_SListNodeBase<Memory::ArenaAllocator>.next,
               (anon_class_8_1_8991fb9c_for_callback)this,false);
  }
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)byteCodeUpwardExposedUsed[1].lastFoundIndex,
             pBStack_50);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)byteCodeUpwardExposedUsed[1].lastFoundIndex,
             local_90.bailoutReferencedArgSymsBv);
  bVar2 = IsPrePass(this);
  if (!bVar2) {
    callback.bailOutInfo = (BailOutInfo *)block;
    callback.bailoutReferencedArgSymsBv = local_90.bailoutReferencedArgSymsBv;
    BailOutInfo::IterateArgOutSyms<BackwardPass::ProcessBailOutInfo(IR::Instr*,BailOutInfo*)::__2>
              ((BailOutInfo *)block,callback);
  }
  Memory::
  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
            (this->tempAlloc,local_90.bailoutReferencedArgSymsBv);
  bVar2 = IsPrePass(this);
  if (bVar2) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,pBStack_50);
  }
  return;
}

Assistant:

void
BackwardPass::ProcessBailOutInfo(IR::Instr * instr, BailOutInfo * bailOutInfo)
{
    /*
    When we optimize functions having try-catch, we install a bailout at the starting of the catch block, namely, BailOnException.
    We don't have flow edges from all the possible exception points in the try to the catch block. As a result, this bailout should
    not try to restore from the constant values or copy-prop syms or the type specialized syms, as these may not necessarily be/have
    the right values. For example,

        //constant values
        c =
        try
        {
            <exception>
            c = k (constant)
        }
        catch
        {
            BailOnException
            = c  <-- We need to restore c from the value outside the try.
        }

        //copy-prop syms
        c =
        try
        {
            b = a
            <exception>
            c = b
        }
        catch
        {
            BailOnException
            = c  <-- We really want to restore c from its original sym, and not from its copy-prop sym, a
        }

        //type specialized syms
        a =
        try
        {
            <exception>
            a++  <-- type specializes a
        }
        catch
        {
            BailOnException
            = a  <-- We need to restore a from its var version.
        }
    */
    BasicBlock * block = this->currentBlock;
    BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed = nullptr;

#if DBG
    if (DoCaptureByteCodeUpwardExposedUsed() &&
        !IsPrePass() &&
        bailOutInfo->bailOutFunc->HasByteCodeOffset() &&
        bailOutInfo->bailOutFunc->byteCodeRegisterUses)
    {
        uint32 offset = bailOutInfo->bailOutOffset;
        Assert(offset != Js::Constants::NoByteCodeOffset);
        BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed = bailOutInfo->bailOutFunc->GetByteCodeOffsetUses(offset);
        if (trackingByteCodeUpwardExposedUsed)
        {
            BVSparse<JitArenaAllocator>* tmpBv = nullptr;
            if (instr->IsBranchInstr())
            {
                IR::BranchInstr* branchInstr = instr->AsBranchInstr();
                IR::LabelInstr* target = branchInstr->GetTarget();
                uint32 targetOffset = target->GetByteCodeOffset();

                // If the instr's label has the same bytecode offset as the instr then move the targetOffset
                // to the next bytecode instr. This can happen when we have airlock blocks or compensation
                // code, but also for infinite loops. Don't do it for the latter.
                if (targetOffset == instr->GetByteCodeOffset() && block != target->GetBasicBlock())
                {
                    // This can happen if the target is a break or airlock block.
                    Assert(
                        target->GetBasicBlock()->isAirLockBlock ||
                        target->GetBasicBlock()->isAirLockCompensationBlock ||
                        target->GetBasicBlock()->isBreakBlock ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSink ||
                        target->GetBasicBlock()->isBreakCompensationBlockAtSource
                    );
                    targetOffset = target->GetNextByteCodeInstr()->GetByteCodeOffset();
                }
                BVSparse<JitArenaAllocator>* branchTargetUpwardExposed = target->m_func->GetByteCodeOffsetUses(targetOffset);
                if (branchTargetUpwardExposed)
                {
                    // The bailout should restore both the bailout destination and
                    // the branch target since we don't know where we'll end up.
                    trackingByteCodeUpwardExposedUsed = tmpBv = trackingByteCodeUpwardExposedUsed->OrNew(branchTargetUpwardExposed);
                }
            }
            Assert(trackingByteCodeUpwardExposedUsed);
            VerifyByteCodeUpwardExposed(block, bailOutInfo->bailOutFunc, trackingByteCodeUpwardExposedUsed, instr, offset);
            if (tmpBv)
            {
                JitAdelete(tmpBv->GetAllocator(), tmpBv);
            }
        }
    }
#endif

    Assert(bailOutInfo->bailOutInstr == instr);

    // The byteCodeUpwardExposedUsed should only be assigned once. The only case which would break this
    // assumption is when we are optimizing a function having try-catch. In that case, we need the
    // byteCodeUpwardExposedUsed analysis in the initial backward pass too.
    Assert(bailOutInfo->byteCodeUpwardExposedUsed == nullptr || (this->func->HasTry() && this->func->DoOptimizeTry()));

    // Make a copy of the byteCodeUpwardExposedUsed so we can remove the constants
    if (!this->IsPrePass())
    {
        // Create the BV of symbols that need to be restored in the BailOutRecord
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->func->m_alloc);
        bailOutInfo->byteCodeUpwardExposedUsed = byteCodeUpwardExposedUsed;
    }
    else
    {
        // Create a temporary byteCodeUpwardExposedUsed
        byteCodeUpwardExposedUsed = block->byteCodeUpwardExposedUsed->CopyNew(this->tempAlloc);
    }

    // All the register-based argument syms need to be tracked. They are either:
    //      1. Referenced as constants in bailOutInfo->usedcapturedValues.constantValues
    //      2. Referenced using copy prop syms in bailOutInfo->usedcapturedValues.copyPropSyms
    //      3. Marked as m_isBailOutReferenced = true & added to upwardExposedUsed bit vector to ensure we do not dead store their defs.
    //      The third set of syms is represented by the bailoutReferencedArgSymsBv.
    BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint, uint, StackSym* sym) {
            if (!sym->IsArgSlotSym())
            {
                bailoutReferencedArgSymsBv->Set(sym->m_id);
            }
        });
    }

    // Process Argument object first, as they can be found on the stack and don't need to rely on copy prop
    this->ProcessBailOutArgObj(bailOutInfo, byteCodeUpwardExposedUsed);

    if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
    {
        this->ProcessBailOutConstants(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
        this->ProcessBailOutCopyProps(bailOutInfo, byteCodeUpwardExposedUsed, bailoutReferencedArgSymsBv);
    }

    BVSparse<JitArenaAllocator> * tempBv = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);

    if (bailOutInfo->liveVarSyms)
    {
        // Prefer to restore from type-specialized versions of the sym, as that will reduce the need for potentially expensive
        // ToVars that can more easily be eliminated due to being dead stores.

#if DBG
        Assert(tempBv->IsEmpty());

        // Verify that all syms to restore are live in some fashion
        tempBv->Minus(byteCodeUpwardExposedUsed, bailOutInfo->liveVarSyms);
        tempBv->Minus(bailOutInfo->liveLosslessInt32Syms);
        tempBv->Minus(bailOutInfo->liveFloat64Syms);
        Assert(tempBv->IsEmpty());
#endif

        if (this->func->IsJitInDebugMode())
        {
            // Add to byteCodeUpwardExposedUsed the non-temp local vars used so far to restore during bail out.
            // The ones that are not used so far will get their values from bytecode when we continue after bail out in interpreter.
            Assert(this->func->m_nonTempLocalVars);
            tempBv->And(this->func->m_nonTempLocalVars, bailOutInfo->liveVarSyms);

            // Remove syms that are restored in other ways than byteCodeUpwardExposedUsed.
            FOREACH_SLIST_ENTRY(ConstantStackSymValue, value, &bailOutInfo->usedCapturedValues->constantValues)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            FOREACH_SLIST_ENTRY(CopyPropSyms, value, &bailOutInfo->usedCapturedValues->copyPropSyms)
            {
                Assert(value.Key()->HasByteCodeRegSlot() || value.Key()->GetInstrDef()->m_opcode == Js::OpCode::BytecodeArgOutCapture);
                if (value.Key()->HasByteCodeRegSlot())
                {
                    tempBv->Clear(value.Key()->GetByteCodeRegSlot());
                }
            }
            NEXT_SLIST_ENTRY;
            if (bailOutInfo->usedCapturedValues->argObjSyms)
            {
                tempBv->Minus(bailOutInfo->usedCapturedValues->argObjSyms);
            }

            byteCodeUpwardExposedUsed->Or(tempBv);
        }

        if (instr->m_opcode != Js::OpCode::BailOnException) // see comment at the beginning of this function
        {
            // Int32
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveLosslessInt32Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * int32StackSym = stackSym->GetInt32EquivSym(nullptr);
                Assert(int32StackSym);
                byteCodeUpwardExposedUsed->Set(int32StackSym->m_id);
            }
            NEXT_BITSET_IN_SPARSEBV;

            // Float64
            tempBv->And(byteCodeUpwardExposedUsed, bailOutInfo->liveFloat64Syms);
            byteCodeUpwardExposedUsed->Minus(tempBv);
            FOREACH_BITSET_IN_SPARSEBV(symId, tempBv)
            {
                StackSym * stackSym = this->func->m_symTable->FindStackSym(symId);
                Assert(stackSym->GetType() == TyVar);
                StackSym * float64StackSym = stackSym->GetFloat64EquivSym(nullptr);
                Assert(float64StackSym);
                byteCodeUpwardExposedUsed->Set(float64StackSym->m_id);

                // This float-specialized sym is going to be used to restore the corresponding byte-code register. Need to
                // ensure that the float value can be precisely coerced back to the original Var value by requiring that it is
                // specialized using BailOutNumberOnly.
                float64StackSym->m_requiresBailOnNotNumber = true;
            }
            NEXT_BITSET_IN_SPARSEBV;
        }
        // Var
        // Any remaining syms to restore will be restored from their var versions
    }
    else
    {
        Assert(!this->func->DoGlobOpt());
    }

    JitAdelete(this->tempAlloc, tempBv);

    // BailOnNoProfile makes some edges dead. Upward exposed symbols info set after the BailOnProfile won't
    // flow through these edges, and, in turn, not through predecessor edges of the block containing the
    // BailOnNoProfile. This is specifically bad for an inlinee's argout syms as they are set as upward exposed
    // when we see the InlineeEnd, but may not look so to some blocks and may get overwritten.
    // Set the argout syms as upward exposed here.
    if (instr->m_opcode == Js::OpCode::BailOnNoProfile && instr->m_func->IsInlinee() &&
        instr->m_func->m_hasInlineArgsOpt && instr->m_func->frameInfo->isRecorded)
    {
        instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
        {
            this->currentBlock->upwardExposedUses->Set(argSym->m_id);
        });
    }

    // Mark all the register that we need to restore as used (excluding constants)
    block->upwardExposedUses->Or(byteCodeUpwardExposedUsed);
    block->upwardExposedUses->Or(bailoutReferencedArgSymsBv);

    if (!this->IsPrePass())
    {
        bailOutInfo->IterateArgOutSyms([=](uint index, uint, StackSym* sym) {
            if (sym->IsArgSlotSym() || bailoutReferencedArgSymsBv->Test(sym->m_id))
            {
                bailOutInfo->argOutSyms[index]->m_isBailOutReferenced = true;
            }
        });
    }

    JitAdelete(this->tempAlloc, bailoutReferencedArgSymsBv);

    if (this->IsPrePass())
    {
        JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
    }
}